

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

int __thiscall
btAlignedObjectArray<btSoftBody::SContact>::copy
          (btAlignedObjectArray<btSoftBody::SContact> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  SContact *pSVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  long in_RCX;
  int i;
  long lVar12;
  
  lVar11 = (long)(int)dst;
  lVar12 = lVar11 << 6;
  for (; lVar11 < (int)src; lVar11 = lVar11 + 1) {
    pSVar3 = this->m_data;
    puVar2 = (undefined8 *)((long)&((SContact *)(&pSVar3->m_weights + -1))->m_node + lVar12);
    uVar4 = *puVar2;
    uVar5 = puVar2[1];
    puVar2 = (undefined8 *)((long)(pSVar3->m_weights).m_floats + lVar12);
    uVar6 = *puVar2;
    uVar7 = puVar2[1];
    puVar2 = (undefined8 *)((long)(pSVar3->m_normal).m_floats + lVar12);
    uVar8 = *puVar2;
    uVar9 = puVar2[1];
    puVar2 = (undefined8 *)((long)pSVar3->m_cfm + lVar12 + -8);
    uVar10 = puVar2[1];
    puVar1 = (undefined8 *)(in_RCX + 0x30 + lVar12);
    *puVar1 = *puVar2;
    puVar1[1] = uVar10;
    puVar2 = (undefined8 *)(in_RCX + 0x20 + lVar12);
    *puVar2 = uVar8;
    puVar2[1] = uVar9;
    puVar2 = (undefined8 *)(in_RCX + 0x10 + lVar12);
    *puVar2 = uVar6;
    puVar2[1] = uVar7;
    *(undefined8 *)(in_RCX + lVar12) = uVar4;
    ((undefined8 *)(in_RCX + lVar12))[1] = uVar5;
    lVar12 = lVar12 + 0x40;
  }
  return (int)lVar11;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}